

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Transformation * __thiscall
TransformParser::parse(Transformation *__return_storage_ptr__,TransformParser *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  code *pcVar3;
  double dVar4;
  allocator<char> local_319;
  string local_318;
  Transformation local_2f8;
  Transformation local_2e0;
  StringView local_2c8;
  float local_2b4;
  undefined1 local_2b0 [4];
  float a_3;
  Transformation local_2a0;
  Transformation local_288;
  StringView local_270;
  float local_25c;
  undefined1 local_258 [4];
  float a_2;
  StringView local_248;
  Transformation local_238;
  Transformation local_220;
  Transformation local_208;
  Transformation local_1f0;
  Transformation local_1d8;
  Transformation local_1c0;
  Transformation local_1a8;
  Transformation local_190;
  float local_178;
  float local_174;
  float y_2;
  float x_2;
  float local_15c;
  undefined1 local_158 [4];
  float a_1;
  Transformation local_148;
  Transformation local_130;
  StringView local_118;
  Parser local_108;
  float local_f8;
  float local_f4;
  float y_1;
  float x_1;
  Transformation local_e0;
  Transformation local_c8;
  StringView local_b0;
  Parser local_a0;
  float local_90;
  float local_8c;
  float y;
  float x;
  Transformation local_78;
  Transformation local_60;
  StringView local_48;
  float local_38;
  float local_34;
  float f;
  float e;
  float d;
  float c;
  float b;
  float a;
  TransformParser *local_10;
  TransformParser *this_local;
  
  local_10 = this;
  Transformation::Transformation(__return_storage_ptr__);
  Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
  do {
    bVar1 = Parser::has_next(&this->super_Parser);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    bVar1 = Parser::parse(&this->super_Parser,"matrix");
    if (bVar1) {
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
      StringView::StringView((StringView *)&b,"(");
      Parser::expect(&this->super_Parser,(StringView *)&b);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
      c = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
      d = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
      e = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
      f = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
      local_34 = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
      local_38 = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
      StringView::StringView(&local_48,")");
      Parser::expect(&this->super_Parser,&local_48);
      Transformation::Transformation(&local_78,c,d,e,f,local_34,local_38);
      ::operator*(&local_60,__return_storage_ptr__,&local_78);
      __return_storage_ptr__->a = local_60.a;
      __return_storage_ptr__->b = local_60.b;
      __return_storage_ptr__->c = local_60.c;
      __return_storage_ptr__->d = local_60.d;
      __return_storage_ptr__->e = local_60.e;
      __return_storage_ptr__->f = local_60.f;
    }
    else {
      bVar1 = Parser::parse(&this->super_Parser,"translate");
      if (bVar1) {
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
        StringView::StringView((StringView *)&y,"(");
        Parser::expect(&this->super_Parser,(StringView *)&y);
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
        local_8c = Parser::parse_number(&this->super_Parser);
        pcVar3 = Parser::white_space_or_comma;
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
        local_90 = 0.0;
        iVar2 = Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)pcVar3,src);
        local_a0.s.s = (char *)CONCAT44(extraout_var,iVar2);
        bVar1 = Parser::parse<bool(&)(Character)>(&local_a0,Parser::number_start_char);
        if (bVar1) {
          local_90 = Parser::parse_number(&this->super_Parser);
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
        }
        StringView::StringView(&local_b0,")");
        Parser::expect(&this->super_Parser,&local_b0);
        Transformation::translate(&local_e0,local_8c,local_90);
        ::operator*(&local_c8,__return_storage_ptr__,&local_e0);
        __return_storage_ptr__->a = local_c8.a;
        __return_storage_ptr__->b = local_c8.b;
        __return_storage_ptr__->c = local_c8.c;
        __return_storage_ptr__->d = local_c8.d;
        __return_storage_ptr__->e = local_c8.e;
        __return_storage_ptr__->f = local_c8.f;
      }
      else {
        bVar1 = Parser::parse(&this->super_Parser,"scale");
        if (bVar1) {
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
          StringView::StringView((StringView *)&y_1,"(");
          Parser::expect(&this->super_Parser,(StringView *)&y_1);
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
          local_f4 = Parser::parse_number(&this->super_Parser);
          pcVar3 = Parser::white_space_or_comma;
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
          local_f8 = local_f4;
          iVar2 = Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)pcVar3,src_00);
          local_108.s.s = (char *)CONCAT44(extraout_var_00,iVar2);
          bVar1 = Parser::parse<bool(&)(Character)>(&local_108,Parser::number_start_char);
          if (bVar1) {
            local_f8 = Parser::parse_number(&this->super_Parser);
            Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
          }
          StringView::StringView(&local_118,")");
          Parser::expect(&this->super_Parser,&local_118);
          Transformation::scale(&local_148,local_f4,local_f8);
          ::operator*(&local_130,__return_storage_ptr__,&local_148);
          __return_storage_ptr__->a = local_130.a;
          __return_storage_ptr__->b = local_130.b;
          __return_storage_ptr__->c = local_130.c;
          __return_storage_ptr__->d = local_130.d;
          __return_storage_ptr__->e = local_130.e;
          __return_storage_ptr__->f = local_130.f;
        }
        else {
          bVar1 = Parser::parse(&this->super_Parser,"rotate");
          if (bVar1) {
            Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
            StringView::StringView((StringView *)local_158,"(");
            Parser::expect(&this->super_Parser,(StringView *)local_158);
            Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
            local_15c = Parser::parse_number(&this->super_Parser);
            local_15c = local_15c * 0.017453292;
            pcVar3 = Parser::white_space;
            Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
            iVar2 = Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)pcVar3,src_01);
            _y_2 = (char *)CONCAT44(extraout_var_01,iVar2);
            bVar1 = Parser::parse<bool(&)(Character)>((Parser *)&y_2,Parser::number_start_char);
            if (bVar1) {
              local_174 = Parser::parse_number(&this->super_Parser);
              Parser::parse_all<bool(&)(Character)>
                        (&this->super_Parser,Parser::white_space_or_comma);
              local_178 = Parser::parse_number(&this->super_Parser);
              Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
              Transformation::translate(&local_1d8,local_174,local_178);
              ::operator*(&local_1c0,__return_storage_ptr__,&local_1d8);
              Transformation::rotate(&local_1f0,local_15c);
              ::operator*(&local_1a8,&local_1c0,&local_1f0);
              Transformation::translate(&local_208,-local_174,-local_178);
              ::operator*(&local_190,&local_1a8,&local_208);
              __return_storage_ptr__->a = local_190.a;
              __return_storage_ptr__->b = local_190.b;
              __return_storage_ptr__->c = local_190.c;
              __return_storage_ptr__->d = local_190.d;
              __return_storage_ptr__->e = local_190.e;
              __return_storage_ptr__->f = local_190.f;
            }
            else {
              Transformation::rotate(&local_238,local_15c);
              ::operator*(&local_220,__return_storage_ptr__,&local_238);
              __return_storage_ptr__->a = local_220.a;
              __return_storage_ptr__->b = local_220.b;
              __return_storage_ptr__->c = local_220.c;
              __return_storage_ptr__->d = local_220.d;
              __return_storage_ptr__->e = local_220.e;
              __return_storage_ptr__->f = local_220.f;
            }
            StringView::StringView(&local_248,")");
            Parser::expect(&this->super_Parser,&local_248);
          }
          else {
            bVar1 = Parser::parse(&this->super_Parser,"skewX");
            if (bVar1) {
              Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
              StringView::StringView((StringView *)local_258,"(");
              Parser::expect(&this->super_Parser,(StringView *)local_258);
              Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
              local_25c = Parser::parse_number(&this->super_Parser);
              local_25c = local_25c * 0.017453292;
              Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
              StringView::StringView(&local_270,")");
              Parser::expect(&this->super_Parser,&local_270);
              dVar4 = std::tan((double)(ulong)(uint)local_25c);
              Transformation::Transformation(&local_2a0,1.0,0.0,SUB84(dVar4,0),1.0,0.0,0.0);
              ::operator*(&local_288,__return_storage_ptr__,&local_2a0);
              __return_storage_ptr__->a = local_288.a;
              __return_storage_ptr__->b = local_288.b;
              __return_storage_ptr__->c = local_288.c;
              __return_storage_ptr__->d = local_288.d;
              __return_storage_ptr__->e = local_288.e;
              __return_storage_ptr__->f = local_288.f;
            }
            else {
              bVar1 = Parser::parse(&this->super_Parser,"skewY");
              if (!bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_318,"unexpected transformation",&local_319);
                Parser::error(&this->super_Parser,&local_318);
              }
              Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
              StringView::StringView((StringView *)local_2b0,"(");
              Parser::expect(&this->super_Parser,(StringView *)local_2b0);
              Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
              local_2b4 = Parser::parse_number(&this->super_Parser);
              local_2b4 = local_2b4 * 0.017453292;
              Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
              StringView::StringView(&local_2c8,")");
              Parser::expect(&this->super_Parser,&local_2c8);
              dVar4 = std::tan((double)(ulong)(uint)local_2b4);
              Transformation::Transformation(&local_2f8,1.0,SUB84(dVar4,0),0.0,1.0,0.0,0.0);
              ::operator*(&local_2e0,__return_storage_ptr__,&local_2f8);
              __return_storage_ptr__->a = local_2e0.a;
              __return_storage_ptr__->b = local_2e0.b;
              __return_storage_ptr__->c = local_2e0.c;
              __return_storage_ptr__->d = local_2e0.d;
              __return_storage_ptr__->e = local_2e0.e;
              __return_storage_ptr__->f = local_2e0.f;
            }
          }
        }
      }
    }
    Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
  } while( true );
}

Assistant:

Transformation parse() {
		Transformation t;
		parse_all(white_space);
		while (has_next()) {
			if (parse("matrix")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number();
				parse_all(white_space_or_comma);
				const float b = parse_number();
				parse_all(white_space_or_comma);
				const float c = parse_number();
				parse_all(white_space_or_comma);
				const float d = parse_number();
				parse_all(white_space_or_comma);
				const float e = parse_number();
				parse_all(white_space_or_comma);
				const float f = parse_number();
				parse_all(white_space);
				expect(")");
				t = t * Transformation(a, b, c, d, e, f);
			}
			else if (parse("translate")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float x = parse_number();
				parse_all(white_space_or_comma);
				float y = 0.f;
				if (copy().parse(number_start_char)) {
					y = parse_number();
					parse_all(white_space);
				}
				expect(")");
				t = t * Transformation::translate(x, y);
			}
			else if (parse("scale")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float x = parse_number();
				parse_all(white_space_or_comma);
				float y = x;
				if (copy().parse(number_start_char)) {
					y = parse_number();
					parse_all(white_space);
				}
				expect(")");
				t = t * Transformation::scale(x, y);
			}
			else if (parse("rotate")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				if (copy().parse(number_start_char)) {
					const float x = parse_number();
					parse_all(white_space_or_comma);
					const float y = parse_number();
					parse_all(white_space);
					t = t * Transformation::translate(x, y) * Transformation::rotate(a) * Transformation::translate(-x, -y);
				}
				else {
					t = t * Transformation::rotate(a);
				}
				expect(")");
			}
			else if (parse("skewX")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				expect(")");
				t = t * Transformation(1.f, 0.f, std::tan(a), 1.f, 0.f, 0.f);
			}
			else if (parse("skewY")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				expect(")");
				t = t * Transformation(1.f, std::tan(a), 0.f, 1.f, 0.f, 0.f);
			}
			else {
				error("unexpected transformation");
			}
			parse_all(white_space);
		}
		return t;
	}